

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

DataView * __thiscall
Js::JavascriptLibrary::CreateDataView
          (JavascriptLibrary *this,ArrayBufferBase *arrayBuffer,uint32 offset,uint32 length)

{
  Recycler *alloc;
  DataView *this_00;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&DataView::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x17ec;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
  this_00 = (DataView *)new<Memory::Recycler>(0x40,alloc,0x37a1d4);
  DataView::DataView(this_00,arrayBuffer,offset,length,(this->dataViewType).ptr);
  return this_00;
}

Assistant:

DataView* JavascriptLibrary::CreateDataView(ArrayBufferBase* arrayBuffer, uint32 offset, uint32 length)
    {
        DataView* dataView = RecyclerNew(this->GetRecycler(), DataView, arrayBuffer, offset, length, dataViewType);

        return dataView;
    }